

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

CTcToken * __thiscall CTcTokenizer::copycur(CTcTokenizer *this)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = is_tok_safe(this,(this->curtok_).typ_);
  if (iVar1 == 0) {
    pcVar2 = store_source(this,(this->curtok_).text_,(this->curtok_).text_len_);
    (this->curtok_).text_ = pcVar2;
  }
  return &this->curtok_;
}

Assistant:

const CTcToken *CTcTokenizer::copycur()
{
    /* if it's already a type that we store safely, return the current token */
    if (is_tok_safe(curtok_.gettyp()))
        return getcur();

    /* save the current token's text in permanent tokenizer memory */
    curtok_.set_text(store_source(curtok_.get_text(), curtok_.get_text_len()),
                     curtok_.get_text_len());

    /* return the current token, now that we've made it safe */
    return &curtok_;
}